

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O0

mk_rconf * mk_rconf_open(char *path)

{
  int iVar1;
  time_t tVar2;
  char *pcVar3;
  mk_rconf *conf;
  int ret;
  char *path_local;
  
  if (path == (char *)0x0) {
    mk_print(0x1002,"[config] invalid path file %s",0);
    path_local = (char *)0x0;
  }
  else {
    path_local = (char *)mk_mem_alloc_z(0x48);
    if ((mk_rconf *)path_local == (mk_rconf *)0x0) {
      perror("malloc");
      path_local = (char *)0x0;
    }
    else {
      tVar2 = time((time_t *)0x0);
      ((mk_rconf *)path_local)->created = (int)tVar2;
      pcVar3 = mk_string_dup(path);
      ((mk_rconf *)path_local)->file = pcVar3;
      ((mk_rconf *)path_local)->level = -1;
      mk_list_init(&((mk_rconf *)path_local)->sections);
      mk_list_init(&((mk_rconf *)path_local)->includes);
      mk_list_init(&((mk_rconf *)path_local)->metas);
      mk_rconf_path_set((mk_rconf *)path_local,path);
      iVar1 = mk_rconf_read((mk_rconf *)path_local,path);
      if (iVar1 == -1) {
        mk_rconf_free((mk_rconf *)path_local);
        path_local = (char *)0x0;
      }
    }
  }
  return (mk_rconf *)path_local;
}

Assistant:

struct mk_rconf *mk_rconf_open(const char *path)
{
    int ret;
    struct mk_rconf *conf = NULL;

    if (!path) {
        mk_warn("[config] invalid path file %s", path);
        return NULL;
    }

    /* Alloc configuration node */
    conf = mk_mem_alloc_z(sizeof(struct mk_rconf));
    if (!conf) {
        perror("malloc");
        return NULL;
    }
    conf->created = time(NULL);
    conf->file = mk_string_dup(path);
    conf->level = -1;
    mk_list_init(&conf->sections);
    mk_list_init(&conf->includes);
    mk_list_init(&conf->metas);

    /* Set the absolute path for the entrypoint file */
    mk_rconf_path_set(conf, (char *) path);

    /* Read entrypoint */
    ret = mk_rconf_read(conf, path);
    if (ret == -1) {
        mk_rconf_free(conf);
        return NULL;
    }

    return conf;
}